

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.hpp
# Opt level: O0

void __thiscall
yactfr::internal::TsdlParser::_validateFlIntTypeMapping<yactfr::FixedLengthUnsignedIntegerType>
          (TsdlParser *this,Size len,TextLocation *loc,string *name,MappingRangeSet *ranges)

{
  char *pcVar1;
  bool bVar2;
  reference this_00;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  ostream *poVar5;
  string local_208;
  ostringstream local_1d8 [8];
  ostringstream ss;
  ulong local_60;
  Value maxUpper;
  Value minLower;
  IntegerRange<unsigned_long_long,_true> *range;
  const_iterator __end0;
  const_iterator __begin0;
  MappingRangeSet *__range2;
  MappingRangeSet *ranges_local;
  string *name_local;
  TextLocation *loc_local;
  Size len_local;
  TsdlParser *this_local;
  
  __end0 = IntegerRangeSet<unsigned_long_long,_true>::begin(ranges);
  range = (IntegerRange<unsigned_long_long,_true> *)
          IntegerRangeSet<unsigned_long_long,_true>::end(ranges);
  while( true ) {
    bVar2 = std::operator!=(&__end0,(_Self *)&range);
    if (!bVar2) {
      return;
    }
    this_00 = std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_true>_>::
              operator*(&__end0);
    uVar3 = std::numeric_limits<unsigned_long_long>::min();
    if (len < 0x40) {
      local_60 = (1L << ((byte)len & 0x3f)) - 1;
    }
    else {
      local_60 = std::numeric_limits<unsigned_long_long>::max();
    }
    uVar4 = IntegerRange<unsigned_long_long,_true>::lower(this_00);
    if (uVar4 < uVar3) break;
    uVar4 = IntegerRange<unsigned_long_long,_true>::upper(this_00);
    if (local_60 < uVar4) break;
    std::_Rb_tree_const_iterator<yactfr::IntegerRange<unsigned_long_long,_true>_>::operator++
              (&__end0);
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar5 = std::operator<<((ostream *)local_1d8,"In mapping `");
  poVar5 = std::operator<<(poVar5,(string *)name);
  poVar5 = std::operator<<(poVar5,"` of enumeration type: at least one value of the range [");
  uVar4 = IntegerRange<unsigned_long_long,_true>::lower(this_00);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
  poVar5 = std::operator<<(poVar5,", ");
  uVar4 = IntegerRange<unsigned_long_long,_true>::upper(this_00);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
  poVar5 = std::operator<<(poVar5,"] doesn\'t fit the range [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_60);
  poVar5 = std::operator<<(poVar5,"] (with a length of ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,len);
  poVar5 = std::operator<<(poVar5," bit");
  pcVar1 = "offset_s";
  if (len == 1) {
    pcVar1 = ".[\\*^$\n";
  }
  poVar5 = std::operator<<(poVar5,pcVar1 + 7);
  std::operator<<(poVar5,").");
  std::__cxx11::ostringstream::str();
  throwTextParseError(&local_208,*loc);
}

Assistant:

void TsdlParser::_validateFlIntTypeMapping(const Size len, const TextLocation& loc,
                                           const std::string& name,
                                           const typename FlIntTypeT::MappingRangeSet& ranges) const
{
    using Value = typename FlIntTypeT::MappingValue;

    for (auto& range : ranges) {
        // validate range storage length
        Value minLower, maxUpper;

        if (std::is_signed<Value>::value) {
            if (len < 63) {
                minLower = -(1LL << (len - 1));
                maxUpper = (1LL << (len - 1)) - 1;
            } else {
                minLower = std::numeric_limits<Value>::min();
                maxUpper = std::numeric_limits<Value>::max();
            }
        } else {
            minLower = std::numeric_limits<Value>::min();

            if (len < 64) {
                maxUpper = (1ULL << len) - 1;
            } else {
                maxUpper = std::numeric_limits<Value>::max();
            }
        }

        if (range.lower() < minLower || range.upper() > maxUpper) {
            std::ostringstream ss;

            ss << "In mapping `" << name << "` of enumeration type: "
                  "at least one value of the range [" << range.lower() <<
                  ", " << range.upper() <<
                  "] doesn't fit the range [" << minLower << ", " << maxUpper << "] "
                  "(with a length of " << len << " bit" << ((len == 1) ? "" : "s") << ").";
            throwTextParseError(ss.str(), loc);
        }
    }
}